

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::SharedDtor(CodeGeneratorResponse_File *this)

{
  string *psVar1;
  CodeGeneratorResponse_File *this_local;
  
  if ((this->name_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->name_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->insertion_point_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->insertion_point_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  if ((this->content_ != (string *)internal::kEmptyString_abi_cxx11_) &&
     (psVar1 = this->content_, psVar1 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)psVar1);
    operator_delete(psVar1,0x20);
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (insertion_point_ != &::google::protobuf::internal::kEmptyString) {
    delete insertion_point_;
  }
  if (content_ != &::google::protobuf::internal::kEmptyString) {
    delete content_;
  }
  if (this != default_instance_) {
  }
}